

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  int iVar5;
  ushort uVar6;
  ZopfliNode *pZVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  anon_union_4_3_cc401a1e_for_u *paVar17;
  size_t sVar18;
  ZopfliNode *pZVar19;
  size_t len;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ZopfliNode *in_stack_fffffffffffffef0;
  ushort local_60;
  
  uVar1 = pos + block_start;
  uVar15 = uVar1 & ringbuffer_mask;
  uVar8 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar8) {
    uVar8 = max_backward_limit;
  }
  uVar9 = num_bytes - pos;
  iVar3 = params->quality;
  uVar28 = 0x145;
  if (iVar3 < 0xb) {
    uVar28 = 0x96;
  }
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,
               (size_t)starting_dist_cache,(int *)model,(ZopfliCostModel *)queue,
               (StartPosQueue *)nodes,in_stack_fffffffffffffef0);
  uVar10 = (ulong)((-(int)queue->idx_ & 7U) << 5);
  fVar41 = (model->literal_costs_[pos] -
           model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar10 - 8))]) +
           *(float *)((long)queue->q_[0].distance_cache + uVar10 + 0x14) + model->min_cost_cmd_;
  lVar21 = 10;
  lVar23 = 4;
  lVar32 = 3;
  for (paVar17 = &nodes[pos + 2].u; ((pos + lVar32) - 1 <= num_bytes && (paVar17->cost <= fVar41));
      paVar17 = paVar17 + 4) {
    bVar39 = lVar32 == lVar21;
    fVar40 = fVar41 + 1.0;
    if (!bVar39) {
      fVar40 = fVar41;
    }
    fVar41 = fVar40;
    lVar29 = 0;
    if (bVar39) {
      lVar29 = lVar23;
    }
    lVar23 = lVar23 << bVar39;
    lVar21 = lVar21 + lVar29;
    lVar32 = lVar32 + 1;
  }
  uVar10 = uVar1;
  if (uVar8 < uVar1) {
    uVar10 = uVar8;
  }
  uVar22 = 0;
  sVar11 = 0;
  do {
    if (uVar22 == (ulong)(10 < iVar3) * 4 + 1) {
      return sVar11;
    }
    uVar20 = queue->idx_;
    uVar30 = 8;
    if (uVar20 < 8) {
      uVar30 = uVar20;
    }
    if (uVar30 <= uVar22) {
      return sVar11;
    }
    uVar20 = (ulong)(((int)uVar22 - (int)uVar20 & 7U) << 5);
    uVar30 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar20 - 8));
    fVar41 = (float)uVar30;
    if (uVar30 < 6) {
      uVar24 = uVar30 & 0xffffffff;
    }
    else if (uVar30 < 0x82) {
      uVar27 = 0x1f;
      uVar13 = (uint)(uVar30 - 2);
      if (uVar13 != 0) {
        for (; uVar13 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar24 = (ulong)((int)(uVar30 - 2 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar27 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar30 < 0x842) {
      uVar27 = 0x1f;
      if ((int)fVar41 - 0x42U != 0) {
        for (; (int)fVar41 - 0x42U >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar24 = (ulong)((uVar27 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar24 = 0x15;
      if (0x1841 < uVar30) {
        uVar24 = (ulong)(ushort)(0x17 - (uVar30 < 0x5842));
      }
    }
    fVar40 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar24 & 0xffff] +
             *(float *)((long)queue->q_[0].distance_cache + uVar20 + 0x10);
    uVar27 = (int)uVar24 * 8 & 0x38;
    iVar5 = (int)((uVar24 & 0xffff) >> 3) * 3;
    uVar36 = 0;
    uVar30 = lVar32 - 2;
    while (((uVar36 < 0x10 && (uVar30 < uVar9)) && (uVar30 + uVar15 <= ringbuffer_mask))) {
      uVar38 = (long)kDistanceCacheOffset[uVar36] +
               (long)*(int *)((long)queue->q_[0].distance_cache +
                             (ulong)kDistanceCacheIndex[uVar36] * 4 + uVar20);
      if ((uVar38 <= uVar10) && (uVar1 - uVar38 < uVar1)) {
        uVar16 = uVar1 - uVar38 & ringbuffer_mask;
        if ((uVar16 + uVar30 <= ringbuffer_mask) &&
           (ringbuffer[uVar30 + uVar15] == ringbuffer[uVar16 + uVar30])) {
          uVar31 = 0;
          lVar21 = 0;
          do {
            uVar25 = (ulong)((uint)uVar9 & 7);
            uVar37 = uVar9 & 0xfffffffffffffff8;
            if (uVar9 >> 3 == uVar31) {
              for (; (uVar31 = uVar9, uVar25 != 0 &&
                     (uVar31 = uVar37, ringbuffer[uVar37 + uVar16] == ringbuffer[uVar37 + uVar15]));
                  uVar37 = uVar37 + 1) {
                uVar25 = uVar25 - 1;
              }
LAB_0011f5d2:
              local_60 = (ushort)uVar24;
              fVar2 = model->cost_dist_[uVar36];
              do {
                iVar35 = (int)uVar30;
                lVar21 = 0;
                pZVar7 = nodes + pos + uVar30;
                do {
                  pZVar19 = pZVar7;
                  uVar16 = uVar30 + lVar21 + 1;
                  if (uVar31 < uVar16) {
                    uVar30 = uVar30 + lVar21;
                    goto LAB_0011f7a0;
                  }
                  iVar33 = (int)lVar21;
                  if (uVar16 < 10) {
                    uVar13 = (iVar35 + iVar33) - 1;
                  }
                  else if (uVar16 < 0x86) {
                    uVar14 = iVar35 + -5 + iVar33;
                    uVar13 = 0x1f;
                    if (uVar14 != 0) {
                      for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                      }
                    }
                    uVar13 = (int)((uVar30 + lVar21) - 5 >>
                                  ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar13 ^ 0xffffffe0) * 2 + 0x42;
                  }
                  else {
                    uVar13 = 0x17;
                    if (uVar16 < 0x846) {
                      uVar14 = iVar35 + -0x45 + iVar33;
                      uVar13 = 0x1f;
                      if (uVar14 != 0) {
                        for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                        }
                      }
                      uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
                    }
                  }
                  uVar6 = (ushort)uVar13;
                  uVar26 = uVar6 & 7 | (ushort)uVar27;
                  if (uVar6 < 0x10 && (uVar36 == 0 && local_60 < 8)) {
                    if (7 < uVar6) {
                      uVar26 = uVar26 + 0x40;
                    }
                  }
                  else {
                    iVar33 = ((uVar13 & 0xffff) >> 3) + iVar5;
                    uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar33 * '\x02' & 0x1fU)) & 0xc0)
                                      + (short)iVar33 * 0x40 + 0x40;
                  }
                  fVar42 = fVar40;
                  if (0x7f < uVar26) {
                    fVar42 = fVar2 + fVar40;
                  }
                  fVar42 = (float)kCopyExtra[uVar13 & 0xffff] + fVar42 + model->cost_cmd_[uVar26];
                  lVar21 = lVar21 + 1;
                  pZVar7 = pZVar19 + 1;
                } while (pZVar19[1].u.cost <= fVar42);
                uVar30 = uVar30 + lVar21;
                pZVar19[1].length = (uint)uVar30 | 0x12000000;
                pZVar19[1].distance = (uint32_t)uVar38;
                pZVar19[1].dcode_insert_length = (uint)fVar41 | (int)uVar36 * 0x8000000 + 0x8000000U
                ;
                pZVar19[1].u.cost = fVar42;
                if (sVar11 <= uVar30) {
                  sVar11 = uVar30;
                }
              } while( true );
            }
            if (*(ulong *)(ringbuffer + uVar31 * 8 + uVar15) !=
                *(ulong *)(ringbuffer + uVar31 * 8 + uVar16)) {
              uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar16) ^
                       *(ulong *)(ringbuffer + uVar31 * 8 + uVar15);
              uVar16 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar31 = (uVar16 >> 3 & 0x1fffffff) - lVar21;
              goto LAB_0011f5d2;
            }
            lVar21 = lVar21 + -8;
            uVar31 = uVar31 + 1;
          } while( true );
        }
      }
LAB_0011f7a0:
      uVar36 = uVar36 + 1;
    }
    if (uVar22 < 2) {
      uVar20 = lVar32 - 1;
      for (sVar18 = 0; sVar18 != num_matches; sVar18 = sVar18 + 1) {
        BVar4 = matches[sVar18];
        uVar38 = (ulong)BVar4 & 0xffffffff;
        uVar30 = uVar38 + 0xf;
        uVar36 = (ulong)(params->dist).num_direct_distance_codes;
        uVar24 = uVar36 + 0x10;
        if (uVar24 <= uVar30) {
          uVar13 = (params->dist).distance_postfix_bits;
          bVar12 = (byte)uVar13;
          uVar30 = ~uVar36 + uVar38 + (4L << (bVar12 & 0x3f));
          uVar14 = 0x1f;
          uVar34 = (uint)uVar30;
          if (uVar34 != 0) {
            for (; uVar34 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar36 = (ulong)((uVar14 ^ 0xffffffe0) + 0x1f);
          lVar21 = uVar36 - uVar13;
          uVar30 = (~(-1 << (bVar12 & 0x1f)) & uVar34) + uVar24 +
                   ((ulong)((uVar30 >> (uVar36 & 0x3f) & 1) != 0) + lVar21 * 2 + -2 <<
                   (bVar12 & 0x3f)) | lVar21 * 0x400;
        }
        uVar36 = (ulong)BVar4 >> 0x25;
        uVar24 = uVar20;
        if (uVar28 < uVar36) {
          uVar24 = uVar36;
        }
        fVar2 = model->cost_dist_[(uint)uVar30 & 0x3ff];
        if (uVar8 < uVar38) {
          uVar24 = uVar36;
        }
        if (uVar20 < uVar36) {
          uVar20 = uVar24;
        }
        uVar24 = (ulong)(BVar4.length_and_code & 0x1f);
        if (((ulong)BVar4 & 0x1f00000000) == 0) {
          uVar24 = uVar36;
        }
        paVar17 = &nodes[pos + uVar20].u;
        lVar21 = uVar20 * 0x2000000 + 0x12000000;
        for (; uVar20 <= uVar36; uVar20 = uVar20 + 1) {
          uVar16 = uVar20;
          if (uVar8 < uVar38) {
            uVar16 = uVar24;
          }
          iVar35 = (int)uVar16;
          if (uVar16 < 10) {
            uVar13 = iVar35 - 2;
          }
          else if (uVar16 < 0x86) {
            uVar13 = 0x1f;
            uVar14 = (uint)(uVar16 - 6);
            if (uVar14 != 0) {
              for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            uVar13 = (int)(uVar16 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar13 ^ 0xffffffe0) * 2 + 0x42;
          }
          else {
            uVar13 = 0x17;
            if (uVar16 < 0x846) {
              uVar13 = 0x1f;
              if (iVar35 - 0x46U != 0) {
                for (; iVar35 - 0x46U >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
            }
          }
          iVar33 = ((uVar13 & 0xffff) >> 3) + iVar5;
          fVar42 = (float)kCopyExtra[uVar13 & 0xffff] +
                   (float)((uint)(uVar30 >> 10) & 0x3f) + fVar40 + fVar2 +
                   model->cost_cmd_
                   [uVar27 + ((0x520d40U >> ((char)iVar33 * '\x02' & 0x1fU) & 0xc0) + iVar33 * 0x40
                             | uVar13 & 7) + 0x40 & 0xffff];
          if (fVar42 < paVar17->cost) {
            ((ZopfliNode *)(paVar17 + -3))->length =
                 (uint)uVar20 | (int)lVar21 + iVar35 * -0x2000000;
            paVar17[-2].next = BVar4.distance;
            paVar17[-1].next = (uint32_t)fVar41;
            paVar17->cost = fVar42;
            if (sVar11 <= uVar20) {
              sVar11 = uVar20;
            }
          }
          paVar17 = paVar17 + 4;
          lVar21 = lVar21 + 0x2000000;
        }
      }
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}